

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O0

ostream * std::operator<<(ostream *os,point3h *v)

{
  ostream *poVar1;
  point3h *v_local;
  ostream *os_local;
  
  poVar1 = std::operator<<(os,"(");
  poVar1 = operator<<(poVar1,&v->x);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = operator<<(poVar1,&v->y);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = operator<<(poVar1,&v->z);
  std::operator<<(poVar1,")");
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const tinyusdz::value::point3h &v) {
  os << "(" << v.x << ", " << v.y << ", " << v.z << ")";
  return os;
}